

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::AddTargetStmt(ByteCodeGenerator *this,ParseNodeStmt *pnodeStmt)

{
  RealCount *pRVar1;
  Type pFVar2;
  Type *ppFVar3;
  Type pSVar4;
  
  ppFVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar2 = *ppFVar3;
  pSVar4 = (Type)new<Memory::ArenaAllocator>(0x10,(pFVar2->targetStatements).allocator,0x366bee);
  pSVar4[1].next = (Type)pnodeStmt;
  pSVar4->next = (pFVar2->targetStatements).
                 super_SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pFVar2->targetStatements).super_SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
  pRVar1 = &(pFVar2->targetStatements).
            super_SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void ByteCodeGenerator::AddTargetStmt(ParseNodeStmt *pnodeStmt)
{
    FuncInfo *top = funcInfoStack->Top();
    top->AddTargetStmt(pnodeStmt);
}